

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O2

void __thiscall
glcts::StateInteractionCase::logProgramInfoLog
          (StateInteractionCase *this,Functions *gl,GLuint program)

{
  ostringstream *this_00;
  TestLog *pTVar1;
  GLenum err;
  GLsizei length;
  GLint value;
  vector<char,_std::allocator<char>_> infoLogBuf;
  GLsizei local_1c8;
  GLint local_1c4;
  _Vector_base<char,_std::allocator<char>_> local_1c0;
  undefined1 local_1a8 [384];
  
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1c4 = 0;
  local_1c8 = 0;
  (*gl->getProgramiv)(program,0x8b84,&local_1c4);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_1c0,(long)(local_1c4 + 1),
             (allocator_type *)local_1a8);
  (*gl->getProgramInfoLog)(program,0,&local_1c8,local_1c0._M_impl.super__Vector_impl_data._M_start);
  err = (*gl->getError)();
  glu::checkError(err,"GetProgramInfoLog failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                  ,0x7dd);
  this_00 = (ostringstream *)(local_1a8 + 8);
  local_1a8._0_8_ = pTVar1;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"Program Log:\n");
  std::operator<<((ostream *)this_00,local_1c0._M_impl.super__Vector_impl_data._M_start);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_1c0);
  return;
}

Assistant:

void logProgramInfoLog(const glw::Functions& gl, glw::GLuint program)
	{
		TestLog&	 log	 = m_testCtx.getLog();
		glw::GLint   value   = 0;
		glw::GLsizei bufSize = 0;
		glw::GLsizei length  = 0;

		gl.getProgramiv(program, GL_INFO_LOG_LENGTH, &value);
		std::vector<char> infoLogBuf(value + 1);

		gl.getProgramInfoLog(program, bufSize, &length, &infoLogBuf[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramInfoLog failed");

		log << TestLog::Message << "Program Log:\n" << &infoLogBuf[0] << TestLog::EndMessage;
	}